

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

parse_buffer * buffer_skip_whitespace(parse_buffer *buffer)

{
  parse_buffer *ppVar1;
  parse_buffer *in_RAX;
  parse_buffer *ppVar2;
  
  if ((buffer != (parse_buffer *)0x0) && (buffer->content != (uchar *)0x0)) {
    ppVar1 = (parse_buffer *)buffer->length;
    ppVar2 = (parse_buffer *)buffer->offset;
    in_RAX = ppVar2;
    if (ppVar2 < ppVar1) {
      do {
        in_RAX = ppVar2;
        if (0x20 < *(byte *)((long)&ppVar2->content + (long)buffer->content)) break;
        ppVar2 = (parse_buffer *)((long)&ppVar2->content + 1);
        buffer->offset = (size_t)ppVar2;
        in_RAX = ppVar1;
      } while (ppVar1 != ppVar2);
    }
    if (in_RAX == ppVar1) {
      in_RAX = (parse_buffer *)((long)&in_RAX[-1].hooks.reallocate + 7);
      buffer->offset = (size_t)in_RAX;
    }
  }
  return in_RAX;
}

Assistant:

static parse_buffer *buffer_skip_whitespace(parse_buffer * const buffer)
{
    if ((buffer == NULL) || (buffer->content == NULL))
    {
        return NULL;
    }

    while (can_access_at_index(buffer, 0) && (buffer_at_offset(buffer)[0] <= 32))
    {
       buffer->offset++;
    }

    if (buffer->offset == buffer->length)
    {
        buffer->offset--;
    }

    return buffer;
}